

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::IsMultiLineData
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pData)

{
  byte bVar1;
  ulong uVar2;
  
  bVar1 = *a_pData;
  uVar2 = (ulong)bVar1;
  if ((0x20 < uVar2) || ((0x100002601U >> (uVar2 & 0x3f) & 1) == 0)) {
    while ((char)uVar2 != '\0') {
      if (((int)uVar2 == 10) || ((int)uVar2 == 0xd)) {
        bVar1 = 1;
        goto LAB_001976da;
      }
      uVar2 = (ulong)((byte *)a_pData)[1];
      a_pData = (char *)((byte *)a_pData + 1);
    }
    bVar1 = ((byte *)a_pData)[-1];
    if (0x20 < bVar1) {
      bVar1 = 0;
      goto LAB_001976da;
    }
  }
  bVar1 = (byte)(0x100002600 >> (bVar1 & 0x3f));
LAB_001976da:
  return (bool)(bVar1 & 1);
}

Assistant:

bool CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::IsMultiLineData(const SI_CHAR *a_pData) const {
	// data is multi-line if it has any of the following features:
	//  * whitespace prefix
	//  * embedded newlines
	//  * whitespace suffix

	// empty string
	if (!*a_pData) {
		return false;
	}

	// check for prefix
	if (IsSpace(*a_pData)) {
		return true;
	}

	// embedded newlines
	while (*a_pData) {
		if (IsNewLineChar(*a_pData)) {
			return true;
		}
		++a_pData;
	}

	// check for suffix
	if (IsSpace(*--a_pData)) {
		return true;
	}

	return false;
}